

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_proj.c
# Opt level: O2

int CVodeSetProjFn(void *cvode_mem,CVProjFn pfun)

{
  undefined8 *puVar1;
  int line;
  int error_code;
  char *msgfmt;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    error_code = -0x15;
    line = 0x35;
    cvode_mem = (CVodeMem)0x0;
  }
  else if (pfun == (CVProjFn)0x0) {
    msgfmt = "The projection function is NULL.";
    error_code = -0x16;
    line = 0x3e;
  }
  else {
    if (*(int *)((long)cvode_mem + 0x20) == 2) {
      puVar1 = *(undefined8 **)((long)cvode_mem + 0x9d8);
      if (puVar1 == (undefined8 *)0x0) {
        puVar1 = (undefined8 *)calloc(1,0x50);
        *(undefined8 **)((long)cvode_mem + 0x9d8) = puVar1;
        if (puVar1 == (undefined8 *)0x0) {
          msgfmt = "A memory request failed.";
          error_code = -0x14;
          line = 0x4f;
          goto LAB_0012a3e9;
        }
        *puVar1 = 0x100000001;
        *(undefined4 *)(puVar1 + 1) = 1;
        puVar1[2] = 1;
        *(undefined4 *)(puVar1 + 4) = 10;
        puVar1[6] = 0x3fb999999999999a;
        puVar1[7] = 0x3fd0000000000000;
      }
      *(undefined4 *)puVar1 = 0;
      puVar1[5] = pfun;
      *(undefined4 *)((long)cvode_mem + 0x9e0) = 1;
      return 0;
    }
    msgfmt = "Projection is only supported with BDF methods.";
    error_code = -0x16;
    line = 0x46;
  }
LAB_0012a3e9:
  cvProcessError((CVodeMem)cvode_mem,error_code,line,"CVodeSetProjFn",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_proj.c"
                 ,msgfmt);
  return error_code;
}

Assistant:

int CVodeSetProjFn(void* cvode_mem, CVProjFn pfun)
{
  int retval;
  CVodeMem cv_mem;
  CVodeProjMem proj_mem;

  /* Check the CVODE memory pointer */
  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__,
                   MSG_CV_MEM_NULL);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* Check if the projection function is NULL */
  if (pfun == NULL)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "The projection function is NULL.");
    return (CV_ILL_INPUT);
  }

  /* Check for compatible method */
  if (cv_mem->cv_lmm != CV_BDF)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "Projection is only supported with BDF methods.");
    return (CV_ILL_INPUT);
  }

  /* Create the projection memory (if necessary) */
  retval = cvProjCreate(&(cv_mem->proj_mem));
  if (retval != CV_SUCCESS)
  {
    cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSG_CV_MEM_FAIL);
    return (CV_MEM_FAIL);
  }

  /* Shortcut to projection memory */
  proj_mem = cv_mem->proj_mem;

  /* User-defined projection */
  proj_mem->internal_proj = SUNFALSE;

  /* Set the projection function */
  proj_mem->pfun = pfun;

  /* Enable projection */
  cv_mem->proj_enabled = SUNTRUE;

  return (CV_SUCCESS);
}